

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O1

void __thiscall QToolBarLayout::setExpanded(QToolBarLayout *this,bool exp)

{
  bool bVar1;
  QWidget *widget;
  QMainWindow *this_00;
  QMainWindowLayout *pQVar2;
  int __sig;
  long in_FS_OFFSET;
  QRect QVar3;
  QSize local_60;
  QList<int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QLayout::parentWidget(&this->super_QLayout);
  widget = (QWidget *)QMetaObject::cast((QObject *)&QToolBar::staticMetaObject);
  if ((widget != (QWidget *)0x0) &&
     (((bool)(this->super_QLayout).super_QLayoutItem.field_0xc != exp ||
      (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) != 0)))) {
    (this->super_QLayout).super_QLayoutItem.field_0xc = exp;
    QAbstractButton::setChecked((QAbstractButton *)this->extension,exp);
    __sig = (int)*(undefined8 *)(*(long *)&widget->field_0x8 + 0x10);
    this_00 = (QMainWindow *)QMetaObject::cast((QObject *)&QMainWindow::staticMetaObject);
    if (this_00 != (QMainWindow *)0x0) {
      if (((widget->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        bVar1 = QMainWindow::isAnimated(this_00);
      }
      else {
        bVar1 = false;
      }
      (this->super_QLayout).super_QLayoutItem.field_0xd = bVar1;
      pQVar2 = qt_mainwindow_layout(this_00);
      if ((this->super_QLayout).super_QLayoutItem.field_0xc == '\x01') {
        QWidget::raise(widget,__sig);
      }
      else {
        local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_58.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
        QMainWindowLayoutState::indexOf(&local_58,&pQVar2->layoutState,widget);
        if ((undefined1 *)local_58.d.size != (undefined1 *)0x0) {
          QVar3 = QMainWindowLayoutState::itemRect(&pQVar2->layoutState,&local_58);
          local_60.wd.m_i = (QVar3.x2.m_i.m_i - QVar3.x1.m_i) + 1;
          local_60.ht.m_i = (QVar3.y2.m_i.m_i - QVar3.y1.m_i) + 1;
          layoutActions(this,&local_60);
        }
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,4,0x10);
          }
        }
      }
      QToolBarAreaLayout::apply
                (&(pQVar2->layoutState).toolBarAreaLayout,
                 (bool)(this->super_QLayout).super_QLayoutItem.field_0xd);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::setExpanded(bool exp)
{
    QWidget *tb = qobject_cast<QToolBar*>(parentWidget());
    if (!tb)
        return;
    if (exp == expanded && !tb->isWindow())
        return;

    expanded = exp;
    extension->setChecked(expanded);

    if (QMainWindow *win = qobject_cast<QMainWindow*>(tb->parentWidget())) {
#if !QT_CONFIG(dockwidget)
        animating = false;
#else
        animating = !tb->isWindow() && win->isAnimated();
#endif
        QMainWindowLayout *layout = qt_mainwindow_layout(win);
        if (expanded) {
            tb->raise();
        } else {
            QList<int> path = layout->layoutState.indexOf(tb);
            if (!path.isEmpty()) {
                QRect rect = layout->layoutState.itemRect(path);
                layoutActions(rect.size());
            }
        }
        layout->layoutState.toolBarAreaLayout.apply(animating);
    }
}